

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evutil.c
# Opt level: O1

int evutil_parse_sockaddr_port(char *ip_as_string,sockaddr *out,int *outlen)

{
  bool bVar1;
  ushort uVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  int iVar6;
  char *unaff_R12;
  size_t __n;
  sockaddr_in sin;
  char buf [128];
  undefined8 local_d8;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  undefined4 uStack_c8;
  undefined8 uStack_c4;
  char local_b8 [136];
  
  pcVar4 = strchr(ip_as_string,0x3a);
  if (*ip_as_string != '[') {
    bVar1 = true;
    if (pcVar4 == (char *)0x0) {
      unaff_R12 = (char *)0x0;
    }
    else {
      unaff_R12 = pcVar4 + 1;
      pcVar5 = strchr(unaff_R12,0x3a);
      if (pcVar5 == (char *)0x0) {
        __n = (long)pcVar4 - (long)ip_as_string;
        if (0x7f < (long)__n) {
          return -1;
        }
        memcpy(local_b8,ip_as_string,__n);
        local_b8[__n] = '\0';
        ip_as_string = local_b8;
      }
      else {
        unaff_R12 = (char *)0x0;
        bVar1 = pcVar5 == (char *)0x0;
      }
    }
    goto LAB_001e69f4;
  }
  pcVar4 = strchr(ip_as_string,0x5d);
  if (pcVar4 == (char *)0x0) {
LAB_001e697b:
    bVar1 = false;
  }
  else {
    unaff_R12 = pcVar4 + -(long)(ip_as_string + 1);
    if ((char *)0x7f < unaff_R12) goto LAB_001e697b;
    memcpy(local_b8,ip_as_string + 1,(size_t)unaff_R12);
    local_b8[(long)unaff_R12] = '\0';
    unaff_R12 = (char *)0x0;
    if (pcVar4[1] == ':') {
      unaff_R12 = pcVar4 + 2;
    }
    bVar1 = true;
  }
  if (!bVar1) {
    return -1;
  }
  ip_as_string = local_b8;
  bVar1 = false;
LAB_001e69f4:
  if (unaff_R12 == (char *)0x0) {
    iVar3 = 0;
  }
  else {
    iVar3 = atoi(unaff_R12);
    if (iVar3 - 0x10000U < 0xffff0001) {
      return -1;
    }
  }
  uVar2 = (ushort)iVar3 << 8 | (ushort)iVar3 >> 8;
  if (bVar1) {
    uStack_d0 = 0;
    uStack_cc = 0;
    local_d8._0_4_ = CONCAT22(uVar2,2);
    local_d8 = (ulong)(uint)local_d8;
    iVar3 = evutil_inet_pton(2,ip_as_string,(void *)((long)&local_d8 + 4));
    iVar6 = -1;
    if ((iVar3 == 1) && (0xf < (long)*outlen)) {
      iVar6 = 0;
      memset(out + 1,0,(long)*outlen - 0x10);
      out->sa_family = (undefined2)local_d8;
      out->sa_data[0] = local_d8._2_1_;
      out->sa_data[1] = local_d8._3_1_;
      out->sa_data[2] = local_d8._4_1_;
      out->sa_data[3] = local_d8._5_1_;
      out->sa_data[4] = local_d8._6_1_;
      out->sa_data[5] = local_d8._7_1_;
      *(ulong *)(out->sa_data + 6) = CONCAT44(uStack_cc,uStack_d0);
      *outlen = 0x10;
    }
  }
  else {
    uStack_d0 = 0;
    uStack_cc = 0;
    uStack_c8 = 0;
    uStack_c4 = 0;
    local_d8._0_4_ = CONCAT22(uVar2,10);
    local_d8 = (ulong)(uint)local_d8;
    iVar3 = evutil_inet_pton(10,ip_as_string,&uStack_d0);
    iVar6 = -1;
    if ((iVar3 == 1) && (0x1b < (long)*outlen)) {
      iVar6 = 0;
      memset(out[1].sa_data + 10,0,(long)*outlen - 0x1c);
      out->sa_family = (undefined2)local_d8;
      out->sa_data[0] = local_d8._2_1_;
      out->sa_data[1] = local_d8._3_1_;
      out->sa_data[2] = local_d8._4_1_;
      out->sa_data[3] = local_d8._5_1_;
      out->sa_data[4] = local_d8._6_1_;
      out->sa_data[5] = local_d8._7_1_;
      *(ulong *)(out->sa_data + 6) = CONCAT44(uStack_cc,uStack_d0);
      *(ulong *)(out->sa_data + 10) = CONCAT44(uStack_c8,uStack_cc);
      *(undefined8 *)(out[1].sa_data + 2) = uStack_c4;
      *outlen = 0x1c;
    }
  }
  return iVar6;
}

Assistant:

int
evutil_parse_sockaddr_port(const char *ip_as_string, struct sockaddr *out, int *outlen)
{
	int port;
	char buf[128];
	const char *cp, *addr_part, *port_part;
	int is_ipv6;
	/* recognized formats are:
	 * [ipv6]:port
	 * ipv6
	 * [ipv6]
	 * ipv4:port
	 * ipv4
	 */

	cp = strchr(ip_as_string, ':');
	if (*ip_as_string == '[') {
		size_t len;
		if (!(cp = strchr(ip_as_string, ']'))) {
			return -1;
		}
		len = ( cp-(ip_as_string + 1) );
		if (len > sizeof(buf)-1) {
			return -1;
		}
		memcpy(buf, ip_as_string+1, len);
		buf[len] = '\0';
		addr_part = buf;
		if (cp[1] == ':')
			port_part = cp+2;
		else
			port_part = NULL;
		is_ipv6 = 1;
	} else if (cp && strchr(cp+1, ':')) {
		is_ipv6 = 1;
		addr_part = ip_as_string;
		port_part = NULL;
	} else if (cp) {
		is_ipv6 = 0;
		if (cp - ip_as_string > (int)sizeof(buf)-1) {
			return -1;
		}
		memcpy(buf, ip_as_string, cp-ip_as_string);
		buf[cp-ip_as_string] = '\0';
		addr_part = buf;
		port_part = cp+1;
	} else {
		addr_part = ip_as_string;
		port_part = NULL;
		is_ipv6 = 0;
	}

	if (port_part == NULL) {
		port = 0;
	} else {
		port = atoi(port_part);
		if (port <= 0 || port > 65535) {
			return -1;
		}
	}

	if (!addr_part)
		return -1; /* Should be impossible. */
#ifdef AF_INET6
	if (is_ipv6)
	{
		struct sockaddr_in6 sin6;
		memset(&sin6, 0, sizeof(sin6));
#ifdef EVENT__HAVE_STRUCT_SOCKADDR_IN6_SIN6_LEN
		sin6.sin6_len = sizeof(sin6);
#endif
		sin6.sin6_family = AF_INET6;
		sin6.sin6_port = htons(port);
		if (1 != evutil_inet_pton(AF_INET6, addr_part, &sin6.sin6_addr))
			return -1;
		if ((int)sizeof(sin6) > *outlen)
			return -1;
		memset(out, 0, *outlen);
		memcpy(out, &sin6, sizeof(sin6));
		*outlen = sizeof(sin6);
		return 0;
	}
	else
#endif
	{
		struct sockaddr_in sin;
		memset(&sin, 0, sizeof(sin));
#ifdef EVENT__HAVE_STRUCT_SOCKADDR_IN_SIN_LEN
		sin.sin_len = sizeof(sin);
#endif
		sin.sin_family = AF_INET;
		sin.sin_port = htons(port);
		if (1 != evutil_inet_pton(AF_INET, addr_part, &sin.sin_addr))
			return -1;
		if ((int)sizeof(sin) > *outlen)
			return -1;
		memset(out, 0, *outlen);
		memcpy(out, &sin, sizeof(sin));
		*outlen = sizeof(sin);
		return 0;
	}
}